

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

void Zyx_TestExact(char *pFileName)

{
  uint uVar1;
  int nVars_00;
  int iVar2;
  FILE *__stream;
  Vec_Wrd_t *vTruths;
  ulong uVar3;
  byte bVar4;
  char *pcVar5;
  int iVar6;
  word *pTruth;
  int nNodes;
  int nLutSize;
  int nVars;
  word pSpec [4];
  char Line [1000];
  int local_45c;
  int local_458;
  int local_454;
  int local_450;
  int local_44c;
  long local_448;
  ulong local_440;
  word local_438 [4];
  char local_418 [1000];
  
  local_454 = -1;
  local_458 = -1;
  local_45c = -1;
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open input file \"%s\".\n",pFileName);
    return;
  }
  iVar2 = Zyx_TestGetTruthTablePars(pFileName,local_438,&local_454,&local_458,&local_45c);
  nVars_00 = local_454;
  iVar6 = local_45c;
  if (iVar2 == 0) {
    return;
  }
  if (local_454 < 9) {
    local_44c = local_458;
    if (local_458 < 7) {
      if (local_45c < 0x11) {
        vTruths = Zyx_TestCreateTruthTables(local_454,local_45c);
        pcVar5 = fgets(local_418,1000,__stream);
        if (pcVar5 != (char *)0x0) {
          bVar4 = (char)nVars_00 - 6;
          local_450 = iVar6 + nVars_00;
          uVar1 = 1 << (bVar4 & 0x1f);
          if (nVars_00 < 7) {
            uVar1 = 1;
          }
          if (nVars_00 < 7) {
            bVar4 = 0;
          }
          local_440 = (ulong)(uint)(iVar6 + -1 + nVars_00 << (bVar4 & 0x1f));
          local_448 = local_440 * 8;
          iVar6 = nVars_00;
          do {
            iVar2 = Zyx_TestReadNode(local_418,vTruths,nVars_00,local_44c,iVar6);
            if (iVar2 == 0) {
              if (iVar6 != local_450) {
                puts("The number of nodes in the structure is not correct.");
                break;
              }
              if (((int)local_440 < 0) || (vTruths->nSize <= (int)local_440)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                              ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
              }
              pTruth = (word *)((long)vTruths->pArray + local_448);
              uVar3 = 0;
              do {
                iVar6 = nVars_00 + -1;
                if (pTruth[uVar3] != local_438[uVar3]) {
                  printf("Structure %3d : Verification FAILED.\n");
                  printf("Implementation: ");
                  Dau_DsdPrintFromTruth(pTruth,nVars_00);
                  printf("Specification:  ");
                  Dau_DsdPrintFromTruth(local_438,nVars_00);
                  goto LAB_005b297d;
                }
                uVar3 = uVar3 + 1;
              } while (uVar1 != uVar3);
              printf("Structure %3d : Verification successful.\n");
            }
LAB_005b297d:
            iVar6 = iVar6 + 1;
            pcVar5 = fgets(local_418,1000,__stream);
          } while (pcVar5 != (char *)0x0);
        }
        if (vTruths->pArray != (word *)0x0) {
          free(vTruths->pArray);
        }
        free(vTruths);
        fclose(__stream);
        return;
      }
      pcVar5 = "This tester does not support structures with more than 16 inputs.";
    }
    else {
      pcVar5 = "This tester does not support nodes with more than 6 inputs.";
    }
  }
  else {
    pcVar5 = "This tester does not support functions with more than 8 inputs.";
  }
  puts(pcVar5);
  return;
}

Assistant:

void Zyx_TestExact( char * pFileName )
{
    int iObj, nStrs = 0, nVars = -1, nLutSize = -1, nNodes = -1;
    word * pImpl, pSpec[4]; Vec_Wrd_t * vInfo; char Line[1000];
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file \"%s\".\n", pFileName );
        return;
    }
    if ( !Zyx_TestGetTruthTablePars( pFileName, pSpec, &nVars, &nLutSize, &nNodes ) )
        return;
    if ( nVars > 8 )
    {
        printf( "This tester does not support functions with more than 8 inputs.\n" );
        return;
    }
    if ( nLutSize > 6 )
    {
        printf( "This tester does not support nodes with more than 6 inputs.\n" );
        return;
    }
    if ( nNodes > 16 )
    {
        printf( "This tester does not support structures with more than 16 inputs.\n" );
        return;
    }
    vInfo = Zyx_TestCreateTruthTables( nVars, nNodes );
    for ( iObj = nVars; fgets(Line, 1000, pFile) != NULL; iObj++ )
    {
        if ( Zyx_TestReadNode( Line, vInfo, nVars, nLutSize, iObj ) )
            continue;
        if ( iObj != nVars + nNodes )
        {
            printf( "The number of nodes in the structure is not correct.\n" );
            break;
        }
        nStrs++;
        pImpl = Zyx_TestTruth( vInfo, iObj-1, Abc_TtWordNum(nVars) );
        if ( Abc_TtEqual( pImpl, pSpec, Abc_TtWordNum(nVars) ) )
            printf( "Structure %3d : Verification successful.\n", nStrs );
        else
        {
            printf( "Structure %3d : Verification FAILED.\n", nStrs );
            printf( "Implementation: " ); Dau_DsdPrintFromTruth( pImpl, nVars );
            printf( "Specification:  " ); Dau_DsdPrintFromTruth( pSpec, nVars );
        }
        iObj = nVars - 1;
    }
    Vec_WrdFree( vInfo );
    fclose( pFile );
}